

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O3

void Prettify(char *buffer,int length,int k)

{
  uint uVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  
  uVar1 = k + length;
  if ((int)uVar1 < 0x16 && -1 < k) {
    if (k != 0) {
      uVar4 = length + 1U;
      if ((int)(length + 1U) < (int)uVar1) {
        uVar4 = uVar1;
      }
      memset(buffer + length,0x30,(ulong)(~length + uVar4) + 1);
    }
    pcVar2 = buffer + (int)uVar1;
    pbVar3 = (byte *)(pcVar2 + 2);
    pcVar2[0] = '.';
    pcVar2[1] = '0';
    goto LAB_002a8019;
  }
  uVar4 = uVar1 - 1;
  if (uVar4 < 0x15) {
    memmove(buffer + uVar1 + 1,buffer + uVar1,(long)-k);
    buffer[uVar1] = '.';
    pbVar3 = (byte *)(buffer + (long)length + 1);
    goto LAB_002a8019;
  }
  if (uVar1 + 5 < 6) {
    uVar4 = 2 - uVar1;
    memmove(buffer + uVar4,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    if ((int)uVar1 < 0) {
      uVar1 = 3;
      if (3 < uVar4) {
        uVar1 = uVar4;
      }
      memset(buffer + 2,0x30,(ulong)(uVar1 - 2));
    }
    pbVar3 = (byte *)(buffer + (int)(uVar4 + length));
    goto LAB_002a8019;
  }
  if (length == 1) {
    buffer[1] = 'e';
    if ((int)uVar4 < 0) {
LAB_002a7fac:
      buffer[2] = '-';
      pbVar3 = (byte *)(buffer + 3);
      uVar4 = 1 - uVar1;
    }
    else {
      pbVar3 = (byte *)(buffer + 2);
    }
  }
  else {
    memmove(buffer + 2,buffer + 1,(long)(length + -1));
    buffer[1] = '.';
    buffer[(long)length + 1] = 'e';
    if ((int)uVar4 < 0) {
      buffer = buffer + length;
      goto LAB_002a7fac;
    }
    pbVar3 = (byte *)(buffer + (long)length + 2);
  }
  if (uVar4 < 100) {
    if (uVar4 < 10) {
      *pbVar3 = (byte)uVar4 | 0x30;
      pbVar3 = pbVar3 + 1;
    }
    else {
      *(undefined2 *)pbVar3 = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)uVar4 * 2);
      pbVar3 = pbVar3 + 2;
    }
  }
  else {
    *pbVar3 = (char)(uVar4 / 100) + 0x30;
    *(undefined2 *)(pbVar3 + 1) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar4 % 100) * 2);
    pbVar3 = pbVar3 + 3;
  }
LAB_002a8019:
  *pbVar3 = 0;
  return;
}

Assistant:

inline void Prettify(char* buffer, int length, int k) {
	const int kk = length + k;	// 10^(kk-1) <= v < 10^kk

	if (length <= kk && kk <= 21) {
		// 1234e7 -> 12340000000
		for (int i = length; i < kk; i++)
			buffer[i] = '0';
		buffer[kk] = '.';
		buffer[kk + 1] = '0';
		buffer[kk + 2] = '\0';
	}
	else if (0 < kk && kk <= 21) {
		// 1234e-2 -> 12.34
		memmove(&buffer[kk + 1], &buffer[kk], size_t(length - kk));
		buffer[kk] = '.';
		buffer[length + 1] = '\0';
	}
	else if (-6 < kk && kk <= 0) {
		// 1234e-6 -> 0.001234
		const int offset = 2 - kk;
		memmove(&buffer[offset], &buffer[0], size_t(length));
		buffer[0] = '0';
		buffer[1] = '.';
		for (int i = 2; i < offset; i++)
			buffer[i] = '0';
		buffer[length + offset] = '\0';
	}
	else if (length == 1) {
		// 1e30
		buffer[1] = 'e';
		WriteExponent(kk - 1, &buffer[2]);
	}
	else {
		// 1234e30 -> 1.234e33
		memmove(&buffer[2], &buffer[1], size_t(length - 1));
		buffer[1] = '.';
		buffer[length + 1] = 'e';
		WriteExponent(kk - 1, &buffer[0 + length + 2]);
	}
}